

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void TestPerfomance(void)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test Perfomance",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  PerfomanceTester<short,_void>::Test();
  PerfomanceTester<unsigned_short,_void>::Test();
  PerfomanceTester<int,_void>::Test();
  PerfomanceTester<unsigned_int,_void>::Test();
  PerfomanceTester<long,_void>::Test();
  PerfomanceTester<unsigned_long,_void>::Test();
  PerfomanceTester<long_long,_void>::Test();
  PerfomanceTester<unsigned_long_long,_void>::Test();
  return;
}

Assistant:

void TestPerfomance()
{
    std::cout << "Test Perfomance" << std::endl;
    PerfomanceTester<short>::Test();
    PerfomanceTester<unsigned short>::Test();
    PerfomanceTester<int>::Test();
    PerfomanceTester<unsigned int>::Test();
    PerfomanceTester<long>::Test();
    PerfomanceTester<unsigned long>::Test();
    PerfomanceTester<long long>::Test();
    PerfomanceTester<unsigned long long>::Test();
}